

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_rms_norm_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  ggml_tensor *pgVar1;
  int n_dims;
  undefined7 in_register_00000011;
  ggml_type type;
  void *data;
  
  if ((int)CONCAT71(in_register_00000011,inplace) == 0) {
    if (a->grad != (ggml_tensor *)0x0) {
      ggml_rms_norm_impl_cold_1();
      pgVar1 = ggml_rms_norm_impl(ctx,a,false);
      return pgVar1;
    }
    if (!inplace) {
      type = a->type;
      n_dims = a->n_dims;
      data = (void *)0x0;
      goto LAB_00120714;
    }
  }
  type = a->type;
  n_dims = a->n_dims;
  data = a->data;
LAB_00120714:
  pgVar1 = ggml_new_tensor_impl(ctx,type,n_dims,a->ne,data);
  pgVar1->op = GGML_OP_RMS_NORM;
  pgVar1->grad = (ggml_tensor *)0x0;
  pgVar1->src0 = a;
  pgVar1->src1 = (ggml_tensor *)0x0;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_rms_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_RMS_NORM;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store epsilon here?

    return result;
}